

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderIntAttribute(ImfHeader *hdr,char *name,int *value)

{
  TypedAttribute<int> *this;
  int *piVar1;
  Header *in_RDX;
  ImfHeader *in_RDI;
  exception *e;
  char *in_stack_ffffffffffffffd8;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<int>>
                   (in_RDX,in_stack_ffffffffffffffd8);
  piVar1 = Imf_3_4::TypedAttribute<int>::value(this);
  *(int *)&(in_RDX->_map)._M_t._M_impl = *piVar1;
  return 1;
}

Assistant:

int
ImfHeaderIntAttribute (const ImfHeader* hdr, const char name[], int* value)
{
    try
    {
        *value =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute> (
                    name)
                .value ();
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}